

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_IntInsert(Vec_Int_t *vProd,Vec_Int_t *vLevel,int Node,int Level)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  uVar2 = (ulong)(uint)vLevel->nSize;
  do {
    uVar3 = uVar2;
    iVar6 = (int)uVar3;
    if (iVar6 < 1) {
      if (iVar6 < 0) goto LAB_0089e8f2;
      break;
    }
    uVar2 = uVar3 - 1;
  } while (vLevel->pArray[uVar3 - 1] < Level);
  if (iVar6 <= vProd->nSize) {
    Vec_IntPush(vProd,0);
    iVar5 = vProd->nSize + -1;
    piVar1 = vProd->pArray;
    if (iVar6 < iVar5) {
      lVar4 = (long)vProd->nSize + -1;
      do {
        piVar1[lVar4] = piVar1[lVar4 + -1];
        lVar4 = lVar4 + -1;
      } while ((long)uVar3 < lVar4);
      iVar5 = (int)lVar4;
    }
    piVar1[iVar5] = Node;
    if (iVar6 <= vLevel->nSize) {
      Vec_IntPush(vLevel,0);
      iVar5 = vLevel->nSize + -1;
      piVar1 = vLevel->pArray;
      if (iVar6 < iVar5) {
        lVar4 = (long)vLevel->nSize + -1;
        do {
          piVar1[lVar4] = piVar1[lVar4 + -1];
          lVar4 = lVar4 + -1;
        } while ((long)uVar3 < lVar4);
        iVar5 = (int)lVar4;
      }
      piVar1[iVar5] = Level;
      return;
    }
  }
LAB_0089e8f2:
  __assert_fail("iHere >= 0 && iHere <= p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x41e,"void Vec_IntInsert(Vec_Int_t *, int, int)");
}

Assistant:

void Wlc_IntInsert( Vec_Int_t * vProd, Vec_Int_t * vLevel, int Node, int Level )
{
    int i;
    for ( i = Vec_IntSize(vLevel) - 1; i >= 0; i-- )
        if ( Vec_IntEntry(vLevel, i) >= Level )
            break;
    Vec_IntInsert( vProd,  i + 1, Node  );
    Vec_IntInsert( vLevel, i + 1, Level );
}